

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int get_input_event(void)

{
  int iVar1;
  int local_c;
  int input;
  int event;
  
  local_c = 0;
  iVar1 = getchar();
  switch(iVar1) {
  case 0x61:
    local_c = 3;
    break;
  case 100:
    local_c = 4;
    break;
  case 0x65:
    local_c = 5;
    break;
  case 0x71:
    local_c = 6;
    break;
  case 0x73:
    local_c = 2;
    break;
  case 0x77:
    local_c = 1;
  }
  return local_c;
}

Assistant:

int get_input_event()
{
	int event = UGUI_EVT_NONE;
	int input = getchar();
	switch (input) {
	case 'a':
		event = UGUI_EVT_LEFT;
		break;
	case 'd':
		event = UGUI_EVT_RIGHT;
		break;
	case 'w':
		event = UGUI_EVT_UP;
		break;
	case 's':
		event = UGUI_EVT_DOWN;
		break;
	case 'e':
		event = UGUI_EVT_SELECT;
		break;
	case 'q':
		event = UGUI_EVT_BACK;
		break;
	}

	return event;
}